

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_jpg_core(stbi__write_context *s,int width,int height,int comp,void *data,int quality)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int local_64c;
  int local_648;
  undefined1 local_644;
  int local_640;
  uchar local_63c;
  int local_638;
  int local_634;
  int local_630;
  int local_62c;
  float b;
  float g;
  float r;
  int p;
  float VDU [64];
  float UDU [64];
  float YDU [64];
  int pos;
  int y;
  int x;
  int ofsB;
  int ofsG;
  int bitCnt;
  int bitBuf;
  int DCV;
  int DCU;
  int DCY;
  uchar *imageData;
  uchar head1 [24];
  int yti;
  int uvti;
  uchar UVTable [64];
  uchar YTable [64];
  float fdtbl_UV [64];
  float fdtbl_Y [64];
  int local_40;
  int k;
  int i;
  int col;
  int row;
  int quality_local;
  void *data_local;
  int comp_local;
  int height_local;
  int width_local;
  stbi__write_context *s_local;
  
  if ((((data == (void *)0x0) || (width == 0)) || (height == 0)) || ((4 < comp || (comp < 1)))) {
    s_local._4_4_ = 0;
  }
  else {
    local_62c = quality;
    if (quality == 0) {
      local_62c = 0x5a;
    }
    if (local_62c < 1) {
      local_630 = 1;
    }
    else {
      if (local_62c < 0x65) {
        local_634 = local_62c;
      }
      else {
        local_634 = 100;
      }
      local_630 = local_634;
    }
    if (local_630 < 0x32) {
      local_638 = (int)(5000 / (long)local_630);
    }
    else {
      local_638 = local_630 * -2 + 200;
    }
    for (local_40 = 0; local_40 < 0x40; local_40 = local_40 + 1) {
      head1._16_4_ = (stbi_write_jpg_core::YQT[local_40] * local_638 + 0x32) / 100;
      if ((int)head1._16_4_ < 1) {
        local_63c = '\x01';
      }
      else {
        local_640 = head1._16_4_;
        if (0xff < (int)head1._16_4_) {
          local_640 = 0xff;
        }
        local_63c = (uchar)local_640;
      }
      UVTable[(ulong)""[local_40] + 0x38] = local_63c;
      head1._20_4_ = (stbi_write_jpg_core::UVQT[local_40] * local_638 + 0x32) / 100;
      if ((int)head1._20_4_ < 1) {
        local_644 = 1;
      }
      else {
        local_648 = head1._20_4_;
        if (0xff < (int)head1._20_4_) {
          local_648 = 0xff;
        }
        local_644 = (undefined1)local_648;
      }
      *(undefined1 *)((long)&yti + (ulong)""[local_40]) = local_644;
    }
    fdtbl_Y[0x3f] = 0.0;
    for (i = 0; i < 8; i = i + 1) {
      for (k = 0; k < 8; k = k + 1) {
        fdtbl_UV[(long)(int)fdtbl_Y[0x3f] + 0x3e] =
             1.0 / ((float)UVTable[(ulong)""[(int)fdtbl_Y[0x3f]] + 0x38] *
                    stbi_write_jpg_core::aasf[i] * stbi_write_jpg_core::aasf[k]);
        fdtbl_UV[(long)(int)fdtbl_Y[0x3f] + -2] =
             1.0 / ((float)*(byte *)((long)&yti + (ulong)""[(int)fdtbl_Y[0x3f]]) *
                    stbi_write_jpg_core::aasf[i] * stbi_write_jpg_core::aasf[k]);
        fdtbl_Y[0x3f] = (float)((int)fdtbl_Y[0x3f] + 1);
      }
    }
    imageData._0_1_ = 0xff;
    imageData._1_1_ = 0xc0;
    imageData._2_1_ = 0;
    imageData._3_1_ = 0x11;
    imageData._4_1_ = 8;
    imageData._5_1_ = (undefined1)((uint)height >> 8);
    imageData._6_1_ = (undefined1)height;
    imageData._7_1_ = (undefined1)((uint)width >> 8);
    head1[0] = (uchar)width;
    builtin_memcpy(head1 + 1,"\x03\x01\x11",4);
    head1[5] = '\x02';
    head1[6] = '\x11';
    head1[7] = '\x01';
    head1[8] = '\x03';
    head1[9] = '\x11';
    head1[10] = '\x01';
    head1[0xb] = 0xff;
    head1[0xc] = 0xc4;
    head1[0xd] = '\x01';
    head1[0xe] = 0xa2;
    head1[0xf] = '\0';
    (*s->func)(s->context,stbi_write_jpg_core::head0,0x19);
    (*s->func)(s->context,UVTable + 0x38,0x40);
    stbiw__putc(s,'\x01');
    (*s->func)(s->context,&yti,0x40);
    (*s->func)(s->context,&imageData,0x18);
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"",0xc);
    stbiw__putc(s,'\x10');
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"\x01\x02\x03",0xa2);
    stbiw__putc(s,'\x01');
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"",0xc);
    stbiw__putc(s,'\x11');
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"",0xa2);
    (*s->func)(s->context,stbi_write_jpg_core::head2,0xe);
    DCV = 0;
    bitBuf = 0;
    bitCnt = 0;
    ofsG = 0;
    ofsB = 0;
    iVar1 = 0;
    if (2 < comp) {
      iVar1 = 2;
    }
    _DCU = data;
    for (YDU[0x3f] = 0.0; (int)YDU[0x3f] < height; YDU[0x3f] = (float)((int)YDU[0x3f] + 8)) {
      for (pos = 0; pos < width; pos = pos + 8) {
        YDU[0x3e] = 0.0;
        for (i = (int)YDU[0x3f]; i < (int)YDU[0x3f] + 8; i = i + 1) {
          for (k = pos; k < pos + 8; k = k + 1) {
            if (stbi__flip_vertically_on_write == 0) {
              local_64c = i;
            }
            else {
              local_64c = (height + -1) - i;
            }
            g = (float)(local_64c * width * comp + k * comp);
            if (height <= i) {
              g = (float)((int)g - width * comp * ((i + 1) - height));
            }
            if (width <= k) {
              g = (float)((int)g - comp * ((k + 1) - width));
            }
            fVar2 = (float)*(byte *)((long)_DCU + (long)(int)g);
            fVar3 = (float)*(byte *)((long)_DCU + (long)(int)((int)g + (uint)(2 < comp)));
            fVar4 = (float)*(byte *)((long)_DCU + (long)((int)g + iVar1));
            UDU[(long)(int)YDU[0x3e] + 0x3e] =
                 (fVar4 * 0.114 + fVar2 * 0.299 + fVar3 * 0.587) - 128.0;
            VDU[(long)(int)YDU[0x3e] + 0x3e] = fVar4 * 0.5 + fVar2 * -0.16874 + -(fVar3 * 0.33126);
            (&r)[(int)YDU[0x3e]] = fVar4 * -0.08131 + fVar2 * 0.5 + -(fVar3 * 0.41869);
            YDU[0x3e] = (float)((int)YDU[0x3e] + 1);
          }
        }
        DCV = stbiw__jpg_processDU
                        (s,&ofsG,&ofsB,UDU + 0x3e,fdtbl_UV + 0x3e,DCV,stbi_write_jpg_core::YDC_HT,
                         stbi_write_jpg_core::YAC_HT);
        bitBuf = stbiw__jpg_processDU
                           (s,&ofsG,&ofsB,VDU + 0x3e,(float *)(YTable + 0x38),bitBuf,
                            stbi_write_jpg_core::UVDC_HT,stbi_write_jpg_core::UVAC_HT);
        bitCnt = stbiw__jpg_processDU
                           (s,&ofsG,&ofsB,&r,(float *)(YTable + 0x38),bitCnt,
                            stbi_write_jpg_core::UVDC_HT,stbi_write_jpg_core::UVAC_HT);
      }
    }
    stbiw__jpg_writeBits(s,&ofsG,&ofsB,stbi_write_jpg_core::fillBits);
    stbiw__putc(s,0xff);
    stbiw__putc(s,0xd9);
    s_local._4_4_ = 1;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi_write_jpg_core(stbi__write_context *s, int width, int height,
                               int comp, const void *data, int quality) {
  // Constants that don't pollute global namespace
  static const unsigned char std_dc_luminance_nrcodes[] = {
      0, 0, 1, 5, 1, 1, 1, 1, 1, 1, 0, 0, 0, 0, 0, 0, 0};
  static const unsigned char std_dc_luminance_values[] = {0, 1, 2, 3, 4,  5,
                                                          6, 7, 8, 9, 10, 11};
  static const unsigned char std_ac_luminance_nrcodes[] = {
      0, 0, 2, 1, 3, 3, 2, 4, 3, 5, 5, 4, 4, 0, 0, 1, 0x7d};
  static const unsigned char std_ac_luminance_values[] = {
      0x01, 0x02, 0x03, 0x00, 0x04, 0x11, 0x05, 0x12, 0x21, 0x31, 0x41, 0x06,
      0x13, 0x51, 0x61, 0x07, 0x22, 0x71, 0x14, 0x32, 0x81, 0x91, 0xa1, 0x08,
      0x23, 0x42, 0xb1, 0xc1, 0x15, 0x52, 0xd1, 0xf0, 0x24, 0x33, 0x62, 0x72,
      0x82, 0x09, 0x0a, 0x16, 0x17, 0x18, 0x19, 0x1a, 0x25, 0x26, 0x27, 0x28,
      0x29, 0x2a, 0x34, 0x35, 0x36, 0x37, 0x38, 0x39, 0x3a, 0x43, 0x44, 0x45,
      0x46, 0x47, 0x48, 0x49, 0x4a, 0x53, 0x54, 0x55, 0x56, 0x57, 0x58, 0x59,
      0x5a, 0x63, 0x64, 0x65, 0x66, 0x67, 0x68, 0x69, 0x6a, 0x73, 0x74, 0x75,
      0x76, 0x77, 0x78, 0x79, 0x7a, 0x83, 0x84, 0x85, 0x86, 0x87, 0x88, 0x89,
      0x8a, 0x92, 0x93, 0x94, 0x95, 0x96, 0x97, 0x98, 0x99, 0x9a, 0xa2, 0xa3,
      0xa4, 0xa5, 0xa6, 0xa7, 0xa8, 0xa9, 0xaa, 0xb2, 0xb3, 0xb4, 0xb5, 0xb6,
      0xb7, 0xb8, 0xb9, 0xba, 0xc2, 0xc3, 0xc4, 0xc5, 0xc6, 0xc7, 0xc8, 0xc9,
      0xca, 0xd2, 0xd3, 0xd4, 0xd5, 0xd6, 0xd7, 0xd8, 0xd9, 0xda, 0xe1, 0xe2,
      0xe3, 0xe4, 0xe5, 0xe6, 0xe7, 0xe8, 0xe9, 0xea, 0xf1, 0xf2, 0xf3, 0xf4,
      0xf5, 0xf6, 0xf7, 0xf8, 0xf9, 0xfa};
  static const unsigned char std_dc_chrominance_nrcodes[] = {
      0, 0, 3, 1, 1, 1, 1, 1, 1, 1, 1, 1, 0, 0, 0, 0, 0};
  static const unsigned char std_dc_chrominance_values[] = {0, 1, 2, 3, 4,  5,
                                                            6, 7, 8, 9, 10, 11};
  static const unsigned char std_ac_chrominance_nrcodes[] = {
      0, 0, 2, 1, 2, 4, 4, 3, 4, 7, 5, 4, 4, 0, 1, 2, 0x77};
  static const unsigned char std_ac_chrominance_values[] = {
      0x00, 0x01, 0x02, 0x03, 0x11, 0x04, 0x05, 0x21, 0x31, 0x06, 0x12, 0x41,
      0x51, 0x07, 0x61, 0x71, 0x13, 0x22, 0x32, 0x81, 0x08, 0x14, 0x42, 0x91,
      0xa1, 0xb1, 0xc1, 0x09, 0x23, 0x33, 0x52, 0xf0, 0x15, 0x62, 0x72, 0xd1,
      0x0a, 0x16, 0x24, 0x34, 0xe1, 0x25, 0xf1, 0x17, 0x18, 0x19, 0x1a, 0x26,
      0x27, 0x28, 0x29, 0x2a, 0x35, 0x36, 0x37, 0x38, 0x39, 0x3a, 0x43, 0x44,
      0x45, 0x46, 0x47, 0x48, 0x49, 0x4a, 0x53, 0x54, 0x55, 0x56, 0x57, 0x58,
      0x59, 0x5a, 0x63, 0x64, 0x65, 0x66, 0x67, 0x68, 0x69, 0x6a, 0x73, 0x74,
      0x75, 0x76, 0x77, 0x78, 0x79, 0x7a, 0x82, 0x83, 0x84, 0x85, 0x86, 0x87,
      0x88, 0x89, 0x8a, 0x92, 0x93, 0x94, 0x95, 0x96, 0x97, 0x98, 0x99, 0x9a,
      0xa2, 0xa3, 0xa4, 0xa5, 0xa6, 0xa7, 0xa8, 0xa9, 0xaa, 0xb2, 0xb3, 0xb4,
      0xb5, 0xb6, 0xb7, 0xb8, 0xb9, 0xba, 0xc2, 0xc3, 0xc4, 0xc5, 0xc6, 0xc7,
      0xc8, 0xc9, 0xca, 0xd2, 0xd3, 0xd4, 0xd5, 0xd6, 0xd7, 0xd8, 0xd9, 0xda,
      0xe2, 0xe3, 0xe4, 0xe5, 0xe6, 0xe7, 0xe8, 0xe9, 0xea, 0xf2, 0xf3, 0xf4,
      0xf5, 0xf6, 0xf7, 0xf8, 0xf9, 0xfa};
  // Huffman tables
  static const unsigned short YDC_HT[256][2] = {
      {0, 2},  {2, 3},  {3, 3},  {4, 3},   {5, 3},   {6, 3},
      {14, 4}, {30, 5}, {62, 6}, {126, 7}, {254, 8}, {510, 9}};
  static const unsigned short UVDC_HT[256][2] = {
      {0, 2},  {1, 2},   {2, 2},   {6, 3},   {14, 4},    {30, 5},
      {62, 6}, {126, 7}, {254, 8}, {510, 9}, {1022, 10}, {2046, 11}};
  static const unsigned short YAC_HT[256][2] = {
      {10, 4},     {0, 2},      {1, 2},      {4, 3},      {11, 4},
      {26, 5},     {120, 7},    {248, 8},    {1014, 10},  {65410, 16},
      {65411, 16}, {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {12, 4},     {27, 5},     {121, 7},
      {502, 9},    {2038, 11},  {65412, 16}, {65413, 16}, {65414, 16},
      {65415, 16}, {65416, 16}, {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {28, 5},     {249, 8},
      {1015, 10},  {4084, 12},  {65417, 16}, {65418, 16}, {65419, 16},
      {65420, 16}, {65421, 16}, {65422, 16}, {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {58, 6},
      {503, 9},    {4085, 12},  {65423, 16}, {65424, 16}, {65425, 16},
      {65426, 16}, {65427, 16}, {65428, 16}, {65429, 16}, {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {59, 6},     {1016, 10},  {65430, 16}, {65431, 16}, {65432, 16},
      {65433, 16}, {65434, 16}, {65435, 16}, {65436, 16}, {65437, 16},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {122, 7},    {2039, 11},  {65438, 16}, {65439, 16},
      {65440, 16}, {65441, 16}, {65442, 16}, {65443, 16}, {65444, 16},
      {65445, 16}, {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {123, 7},    {4086, 12},  {65446, 16},
      {65447, 16}, {65448, 16}, {65449, 16}, {65450, 16}, {65451, 16},
      {65452, 16}, {65453, 16}, {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {250, 8},    {4087, 12},
      {65454, 16}, {65455, 16}, {65456, 16}, {65457, 16}, {65458, 16},
      {65459, 16}, {65460, 16}, {65461, 16}, {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {504, 9},
      {32704, 15}, {65462, 16}, {65463, 16}, {65464, 16}, {65465, 16},
      {65466, 16}, {65467, 16}, {65468, 16}, {65469, 16}, {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {505, 9},    {65470, 16}, {65471, 16}, {65472, 16}, {65473, 16},
      {65474, 16}, {65475, 16}, {65476, 16}, {65477, 16}, {65478, 16},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {506, 9},    {65479, 16}, {65480, 16}, {65481, 16},
      {65482, 16}, {65483, 16}, {65484, 16}, {65485, 16}, {65486, 16},
      {65487, 16}, {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {1017, 10},  {65488, 16}, {65489, 16},
      {65490, 16}, {65491, 16}, {65492, 16}, {65493, 16}, {65494, 16},
      {65495, 16}, {65496, 16}, {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {1018, 10},  {65497, 16},
      {65498, 16}, {65499, 16}, {65500, 16}, {65501, 16}, {65502, 16},
      {65503, 16}, {65504, 16}, {65505, 16}, {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {2040, 11},
      {65506, 16}, {65507, 16}, {65508, 16}, {65509, 16}, {65510, 16},
      {65511, 16}, {65512, 16}, {65513, 16}, {65514, 16}, {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {65515, 16}, {65516, 16}, {65517, 16}, {65518, 16}, {65519, 16},
      {65520, 16}, {65521, 16}, {65522, 16}, {65523, 16}, {65524, 16},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {2041, 11},  {65525, 16}, {65526, 16}, {65527, 16}, {65528, 16},
      {65529, 16}, {65530, 16}, {65531, 16}, {65532, 16}, {65533, 16},
      {65534, 16}, {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {0, 0}};
  static const unsigned short UVAC_HT[256][2] = {
      {0, 2},      {1, 2},      {4, 3},      {10, 4},     {24, 5},
      {25, 5},     {56, 6},     {120, 7},    {500, 9},    {1014, 10},
      {4084, 12},  {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {11, 4},     {57, 6},     {246, 8},
      {501, 9},    {2038, 11},  {4085, 12},  {65416, 16}, {65417, 16},
      {65418, 16}, {65419, 16}, {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {26, 5},     {247, 8},
      {1015, 10},  {4086, 12},  {32706, 15}, {65420, 16}, {65421, 16},
      {65422, 16}, {65423, 16}, {65424, 16}, {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {27, 5},
      {248, 8},    {1016, 10},  {4087, 12},  {65425, 16}, {65426, 16},
      {65427, 16}, {65428, 16}, {65429, 16}, {65430, 16}, {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {58, 6},     {502, 9},    {65431, 16}, {65432, 16}, {65433, 16},
      {65434, 16}, {65435, 16}, {65436, 16}, {65437, 16}, {65438, 16},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {59, 6},     {1017, 10},  {65439, 16}, {65440, 16},
      {65441, 16}, {65442, 16}, {65443, 16}, {65444, 16}, {65445, 16},
      {65446, 16}, {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {121, 7},    {2039, 11},  {65447, 16},
      {65448, 16}, {65449, 16}, {65450, 16}, {65451, 16}, {65452, 16},
      {65453, 16}, {65454, 16}, {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {122, 7},    {2040, 11},
      {65455, 16}, {65456, 16}, {65457, 16}, {65458, 16}, {65459, 16},
      {65460, 16}, {65461, 16}, {65462, 16}, {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {249, 8},
      {65463, 16}, {65464, 16}, {65465, 16}, {65466, 16}, {65467, 16},
      {65468, 16}, {65469, 16}, {65470, 16}, {65471, 16}, {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {503, 9},    {65472, 16}, {65473, 16}, {65474, 16}, {65475, 16},
      {65476, 16}, {65477, 16}, {65478, 16}, {65479, 16}, {65480, 16},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {504, 9},    {65481, 16}, {65482, 16}, {65483, 16},
      {65484, 16}, {65485, 16}, {65486, 16}, {65487, 16}, {65488, 16},
      {65489, 16}, {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {505, 9},    {65490, 16}, {65491, 16},
      {65492, 16}, {65493, 16}, {65494, 16}, {65495, 16}, {65496, 16},
      {65497, 16}, {65498, 16}, {0, 0},      {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {506, 9},    {65499, 16},
      {65500, 16}, {65501, 16}, {65502, 16}, {65503, 16}, {65504, 16},
      {65505, 16}, {65506, 16}, {65507, 16}, {0, 0},      {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {2041, 11},
      {65508, 16}, {65509, 16}, {65510, 16}, {65511, 16}, {65512, 16},
      {65513, 16}, {65514, 16}, {65515, 16}, {65516, 16}, {0, 0},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {16352, 14}, {65517, 16}, {65518, 16}, {65519, 16}, {65520, 16},
      {65521, 16}, {65522, 16}, {65523, 16}, {65524, 16}, {65525, 16},
      {0, 0},      {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {1018, 10},  {32707, 15}, {65526, 16}, {65527, 16}, {65528, 16},
      {65529, 16}, {65530, 16}, {65531, 16}, {65532, 16}, {65533, 16},
      {65534, 16}, {0, 0},      {0, 0},      {0, 0},      {0, 0},
      {0, 0}};
  static const int YQT[] = {
      16, 11, 10, 16, 24,  40,  51,  61,  12, 12, 14, 19, 26,  58,  60,  55,
      14, 13, 16, 24, 40,  57,  69,  56,  14, 17, 22, 29, 51,  87,  80,  62,
      18, 22, 37, 56, 68,  109, 103, 77,  24, 35, 55, 64, 81,  104, 113, 92,
      49, 64, 78, 87, 103, 121, 120, 101, 72, 92, 95, 98, 112, 100, 103, 99};
  static const int UVQT[] = {17, 18, 24, 47, 99, 99, 99, 99, 18, 21, 26, 66, 99,
                             99, 99, 99, 24, 26, 56, 99, 99, 99, 99, 99, 47, 66,
                             99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99,
                             99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99,
                             99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99};
  static const float aasf[] = {
      1.0f * 2.828427125f,         1.387039845f * 2.828427125f,
      1.306562965f * 2.828427125f, 1.175875602f * 2.828427125f,
      1.0f * 2.828427125f,         0.785694958f * 2.828427125f,
      0.541196100f * 2.828427125f, 0.275899379f * 2.828427125f};

  int row, col, i, k;
  float fdtbl_Y[64], fdtbl_UV[64];
  unsigned char YTable[64], UVTable[64];

  if (!data || !width || !height || comp > 4 || comp < 1) {
    return 0;
  }

  quality = quality ? quality : 90;
  quality = quality < 1 ? 1 : quality > 100 ? 100 : quality;
  quality = quality < 50 ? 5000 / quality : 200 - quality * 2;

  for (i = 0; i < 64; ++i) {
    int uvti, yti = (YQT[i] * quality + 50) / 100;
    YTable[stbiw__jpg_ZigZag[i]] =
        (unsigned char)(yti < 1 ? 1 : yti > 255 ? 255 : yti);
    uvti = (UVQT[i] * quality + 50) / 100;
    UVTable[stbiw__jpg_ZigZag[i]] =
        (unsigned char)(uvti < 1 ? 1 : uvti > 255 ? 255 : uvti);
  }

  for (row = 0, k = 0; row < 8; ++row) {
    for (col = 0; col < 8; ++col, ++k) {
      fdtbl_Y[k] = 1 / (YTable[stbiw__jpg_ZigZag[k]] * aasf[row] * aasf[col]);
      fdtbl_UV[k] = 1 / (UVTable[stbiw__jpg_ZigZag[k]] * aasf[row] * aasf[col]);
    }
  }

  // Write Headers
  {
    static const unsigned char head0[] = {
        0xFF, 0xD8, 0xFF, 0xE0, 0, 0x10, 'J', 'F',  'I',  'F', 0,    1, 1,
        0,    0,    1,    0,    1, 0,    0,   0xFF, 0xDB, 0,   0x84, 0};
    static const unsigned char head2[] = {0xFF, 0xDA, 0, 0xC,  3, 1,    0,
                                          2,    0x11, 3, 0x11, 0, 0x3F, 0};
    const unsigned char head1[] = {0xFF,
                                   0xC0,
                                   0,
                                   0x11,
                                   8,
                                   (unsigned char)(height >> 8),
                                   STBIW_UCHAR(height),
                                   (unsigned char)(width >> 8),
                                   STBIW_UCHAR(width),
                                   3,
                                   1,
                                   0x11,
                                   0,
                                   2,
                                   0x11,
                                   1,
                                   3,
                                   0x11,
                                   1,
                                   0xFF,
                                   0xC4,
                                   0x01,
                                   0xA2,
                                   0};
    s->func(s->context, (void *)head0, sizeof(head0));
    s->func(s->context, (void *)YTable, sizeof(YTable));
    stbiw__putc(s, 1);
    s->func(s->context, UVTable, sizeof(UVTable));
    s->func(s->context, (void *)head1, sizeof(head1));
    s->func(s->context, (void *)(std_dc_luminance_nrcodes + 1),
            sizeof(std_dc_luminance_nrcodes) - 1);
    s->func(s->context, (void *)std_dc_luminance_values,
            sizeof(std_dc_luminance_values));
    stbiw__putc(s, 0x10);  // HTYACinfo
    s->func(s->context, (void *)(std_ac_luminance_nrcodes + 1),
            sizeof(std_ac_luminance_nrcodes) - 1);
    s->func(s->context, (void *)std_ac_luminance_values,
            sizeof(std_ac_luminance_values));
    stbiw__putc(s, 1);  // HTUDCinfo
    s->func(s->context, (void *)(std_dc_chrominance_nrcodes + 1),
            sizeof(std_dc_chrominance_nrcodes) - 1);
    s->func(s->context, (void *)std_dc_chrominance_values,
            sizeof(std_dc_chrominance_values));
    stbiw__putc(s, 0x11);  // HTUACinfo
    s->func(s->context, (void *)(std_ac_chrominance_nrcodes + 1),
            sizeof(std_ac_chrominance_nrcodes) - 1);
    s->func(s->context, (void *)std_ac_chrominance_values,
            sizeof(std_ac_chrominance_values));
    s->func(s->context, (void *)head2, sizeof(head2));
  }

  // Encode 8x8 macroblocks
  {
    static const unsigned short fillBits[] = {0x7F, 7};
    const unsigned char *imageData = (const unsigned char *)data;
    int DCY = 0, DCU = 0, DCV = 0;
    int bitBuf = 0, bitCnt = 0;
    // comp == 2 is grey+alpha (alpha is ignored)
    int ofsG = comp > 2 ? 1 : 0, ofsB = comp > 2 ? 2 : 0;
    int x, y, pos;
    for (y = 0; y < height; y += 8) {
      for (x = 0; x < width; x += 8) {
        float YDU[64], UDU[64], VDU[64];
        for (row = y, pos = 0; row < y + 8; ++row) {
          for (col = x; col < x + 8; ++col, ++pos) {
            int p = (stbi__flip_vertically_on_write ? height - 1 - row : row) *
                        width * comp +
                    col * comp;
            float r, g, b;
            if (row >= height) {
              p -= width * comp * (row + 1 - height);
            }
            if (col >= width) {
              p -= comp * (col + 1 - width);
            }

            r = imageData[p + 0];
            g = imageData[p + ofsG];
            b = imageData[p + ofsB];
            YDU[pos] = +0.29900f * r + 0.58700f * g + 0.11400f * b - 128;
            UDU[pos] = -0.16874f * r - 0.33126f * g + 0.50000f * b;
            VDU[pos] = +0.50000f * r - 0.41869f * g - 0.08131f * b;
          }
        }

        DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, YDU, fdtbl_Y, DCY,
                                   YDC_HT, YAC_HT);
        DCU = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, UDU, fdtbl_UV, DCU,
                                   UVDC_HT, UVAC_HT);
        DCV = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, VDU, fdtbl_UV, DCV,
                                   UVDC_HT, UVAC_HT);
      }
    }

    // Do the bit alignment of the EOI marker
    stbiw__jpg_writeBits(s, &bitBuf, &bitCnt, fillBits);
  }

  // EOI
  stbiw__putc(s, 0xFF);
  stbiw__putc(s, 0xD9);

  return 1;
}